

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer-source-line-finder.cc
# Opt level: O0

Result __thiscall
wabt::LexerSourceLineFinder::GetSourceLine
          (LexerSourceLineFinder *this,Location *loc,Offset max_line_length,
          SourceLine *out_source_line)

{
  bool bVar1;
  Result RVar2;
  pointer this_00;
  iterator __first;
  iterator __last;
  Offset in_R8;
  OffsetRange offset_range;
  undefined1 local_98 [8];
  vector<char,_std::allocator<char>_> read_line;
  bool has_end_ellipsis;
  bool has_start_ellipsis;
  undefined1 local_60 [8];
  OffsetRange clamped;
  undefined1 local_48 [8];
  OffsetRange original;
  ColumnRange column_range;
  SourceLine *out_source_line_local;
  Offset max_line_length_local;
  Location *loc_local;
  LexerSourceLineFinder *this_local;
  
  Range<int>::Range((Range<int> *)&original.end,(loc->field_1).field_0.first_column,
                    (loc->field_1).field_0.last_column);
  Range<unsigned_long>::Range((Range<unsigned_long> *)local_48);
  RVar2 = GetLineOffsets(this,(loc->field_1).field_0.line,(OffsetRange *)local_48);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    offset_range.end = original.end;
    offset_range.start = original.start;
    _local_60 = ClampSourceLineOffsets
                          ((LexerSourceLineFinder *)local_48,offset_range,
                           (ColumnRange)max_line_length,in_R8);
    read_line.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ = local_48 != local_60;
    read_line.super__Vector_base<char,_std::allocator<char>_>._M_impl._22_1_ =
         original.start != clamped.start;
    out_source_line->column_offset = local_60._0_4_ - local_48._0_4_;
    if ((bool)read_line.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_) {
      std::__cxx11::string::operator+=((string *)out_source_line,"...");
      local_60 = (undefined1  [8])
                 ((long)&(((unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_> *
                           )local_60)->_M_t).
                         super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>
                         .super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl + 3);
    }
    if ((read_line.super__Vector_base<char,_std::allocator<char>_>._M_impl._22_1_ & 1) != 0) {
      clamped.start = clamped.start - 3;
    }
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_98);
    this_00 = std::unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>::
              operator->(&this->source_);
    RVar2 = LexerSource::ReadRange
                      (this_00,_local_60,(vector<char,_std::allocator<char>_> *)local_98);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      __first = std::vector<char,_std::allocator<char>_>::begin
                          ((vector<char,_std::allocator<char>_> *)local_98);
      __last = std::vector<char,_std::allocator<char>_>::end
                         ((vector<char,_std::allocator<char>_> *)local_98);
      std::__cxx11::string::
      append<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
                ((string *)out_source_line,
                 (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
                 __first._M_current,
                 (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
                 __last._M_current);
      if ((read_line.super__Vector_base<char,_std::allocator<char>_>._M_impl._22_1_ & 1) != 0) {
        std::__cxx11::string::operator+=((string *)out_source_line,"...");
      }
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)local_98);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result LexerSourceLineFinder::GetSourceLine(const Location& loc,
                                            Offset max_line_length,
                                            SourceLine* out_source_line) {
  ColumnRange column_range(loc.first_column, loc.last_column);
  OffsetRange original;
  CHECK_RESULT(GetLineOffsets(loc.line, &original));

  OffsetRange clamped =
      ClampSourceLineOffsets(original, column_range, max_line_length);
  bool has_start_ellipsis = original.start != clamped.start;
  bool has_end_ellipsis = original.end != clamped.end;

  out_source_line->column_offset = clamped.start - original.start;

  if (has_start_ellipsis) {
    out_source_line->line += "...";
    clamped.start += 3;
  }
  if (has_end_ellipsis) {
    clamped.end -= 3;
  }

  std::vector<char> read_line;
  CHECK_RESULT(source_->ReadRange(clamped, &read_line));
  out_source_line->line.append(read_line.begin(), read_line.end());

  if (has_end_ellipsis) {
    out_source_line->line += "...";
  }

  return Result::Ok;
}